

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O1

ByteArray *
ot::commissioner::Commissioner::ComputeJoinerId(ByteArray *__return_storage_ptr__,uint64_t aEui64)

{
  byte *pbVar1;
  ByteArray eui64;
  uint8_t hash [32];
  Sha256 sha256;
  allocator_type local_c9;
  ByteArray local_c8;
  uint8_t local_a8 [8];
  uchar local_a0 [36];
  Sha256 local_7c;
  
  Sha256::Sha256(&local_7c);
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uint8_t *)0x0;
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  utils::Encode<unsigned_long>(&local_c8,aEui64);
  Sha256::Start(&local_7c);
  Sha256::Update(&local_7c,
                 local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (short)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (short)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  Sha256::Finish(&local_7c,local_a8);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,local_a8,
             local_a0,&local_c9);
  pbVar1 = (__return_storage_ptr__->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  *pbVar1 = *pbVar1 | 2;
  if (local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  Sha256::~Sha256(&local_7c);
  return __return_storage_ptr__;
}

Assistant:

ByteArray Commissioner::ComputeJoinerId(uint64_t aEui64)
{
    Sha256    sha256;
    uint8_t   hash[Sha256::kHashSize];
    ByteArray eui64;

    utils::Encode(eui64, aEui64);

    sha256.Start();
    sha256.Update(&eui64[0], eui64.size());
    sha256.Finish(hash);

    static_assert(sizeof(hash) >= kJoinerIdLength, "wrong crypto::Sha256::kHashSize value");

    ByteArray joinerId{hash, hash + kJoinerIdLength};
    joinerId[0] |= kLocalExternalAddrMask;
    return joinerId;
}